

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O0

MovePtr<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_> *
deqp::gles31::Functional::anon_unknown_1::TextureTraits<glu::Texture3D>::
createTextureFromInternalFormat
          (MovePtr<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_> *__return_storage_ptr__,
          RenderContext *renderCtx,deUint32 texFormat,IVec3 *size)

{
  deUint32 sizedFormat;
  RenderContext *context;
  int width;
  int height;
  int depth;
  Texture3D *this;
  DefaultDeleter<glu::Texture3D> local_35 [13];
  Vector<int,_3> *local_28;
  IVec3 *size_local;
  RenderContext *pRStack_18;
  deUint32 texFormat_local;
  RenderContext *renderCtx_local;
  
  local_28 = size;
  size_local._4_4_ = texFormat;
  pRStack_18 = renderCtx;
  renderCtx_local = (RenderContext *)__return_storage_ptr__;
  this = (Texture3D *)operator_new(0x70);
  context = pRStack_18;
  sizedFormat = size_local._4_4_;
  width = tcu::Vector<int,_3>::x(local_28);
  height = tcu::Vector<int,_3>::y(local_28);
  depth = tcu::Vector<int,_3>::z(local_28);
  glu::Texture3D::Texture3D(this,context,sizedFormat,width,height,depth);
  de::DefaultDeleter<glu::Texture3D>::DefaultDeleter(local_35);
  de::details::MovePtr<glu::Texture3D,_de::DefaultDeleter<glu::Texture3D>_>::MovePtr
            (__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

static de::MovePtr<glu::Texture3D> createTextureFromInternalFormat (glu::RenderContext& renderCtx, deUint32 texFormat, const tcu::IVec3& size)
	{
		return de::MovePtr<glu::Texture3D>(new glu::Texture3D(renderCtx, texFormat, size.x(), size.y(), size.z()));
	}